

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Function *f)

{
  pointer ppVar1;
  Expression *pEVar2;
  pool_ref<soul::AST::VariableDeclaration> *v;
  pointer ppVar3;
  
  pEVar2 = pool_ptr<soul::AST::Expression>::operator*(&f->returnType);
  (*this->_vptr_ASTVisitor[3])(this,pEVar2);
  ppVar1 = (f->parameters).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (f->parameters).
                super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    (*this->_vptr_ASTVisitor[4])(this,ppVar3->object);
  }
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Block>>(this,&f->block);
  return;
}

Assistant:

virtual void visit (AST::Function& f)
    {
        visitObject (*f.returnType);

        for (auto& v : f.parameters)
            visitObject (v);

        visitObjectIfNotNull (f.block);
    }